

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

ExecState __thiscall
Process::startInternal
          (Process *this,Path *command,List<String> *a,List<String> *environment,int timeout,
          uint execFlags)

{
  pointer pSVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  char **__argv;
  String *pSVar12;
  ssize_t sVar13;
  char **ppcVar14;
  pointer pSVar15;
  int iVar16;
  int iVar17;
  String *it;
  pointer pSVar18;
  timeval *__timeout;
  ulong uVar19;
  char *path;
  long lVar20;
  ExecState EVar21;
  const_iterator it_1;
  int closePipe [2];
  fd_set rfds;
  timeval timeoutForSelect;
  List<String> arguments;
  timeval now;
  timeval started;
  Path cmd;
  char c;
  int local_21c;
  int local_218;
  uint local_214;
  String *local_210;
  string *local_208;
  int *local_200;
  int *local_1f8;
  int *local_1f0;
  pthread_mutex_t *local_1e8;
  Process *local_1e0 [2];
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [16];
  __pthread_internal_list local_198;
  _Base_ptr local_188;
  _Base_ptr p_Stack_180;
  size_t local_178;
  undefined1 auStack_170 [80];
  _Base_ptr local_120;
  Signal<std::function<void(Process*)>> *local_118;
  undefined1 local_110 [24];
  timeval local_f8;
  timeval local_e8;
  Path local_d8;
  undefined1 local_b8 [136];
  
  local_1f8 = (int *)CONCAT44(local_1f8._4_4_,execFlags);
  (this->mErrorString).mString._M_string_length = 0;
  *(this->mErrorString).mString._M_dataplus._M_p = '\0';
  pSVar18 = (environment->super_vector<String,_std::allocator<String>_>).
            super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
            _M_start;
  pSVar1 = (environment->super_vector<String,_std::allocator<String>_>).
           super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  local_214 = timeout;
  local_210 = (String *)environment;
  local_200 = (int *)a;
  if (pSVar18 == pSVar1) {
    path = (char *)0x0;
  }
  else {
    path = (pointer)0x0;
    do {
      bVar3 = String::startsWith(pSVar18,"PATH=",0xffffffffffffffff,CaseSensitive);
      if (bVar3) {
        path = (pSVar18->mString)._M_dataplus._M_p + 5;
      }
      pSVar18 = pSVar18 + 1;
    } while (!bVar3 && pSVar18 != pSVar1);
  }
  local_208 = (string *)&this->mErrorString;
  findCommand(&local_d8,&command->super_String,path);
  if ((_Base_ptr)local_d8.super_String.mString._M_string_length == (_Base_ptr)0x0) {
    String::String((String *)(local_1d0 + 0x28),"Command not found",0xffffffffffffffff);
    std::__cxx11::string::operator=(local_208,(string *)(local_1d0 + 0x28));
    if ((__pthread_internal_list *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_);
    }
    EVar21 = Error;
    goto LAB_00172df7;
  }
  std::vector<String,_std::allocator<String>_>::vector
            ((vector<String,_std::allocator<String>_> *)local_110,
             (vector<String,_std::allocator<String>_> *)local_200);
  do {
    iVar4 = pipe(&local_21c);
    if (iVar4 != -1) break;
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  bVar3 = SocketClient::setFlags(local_218,1,1,2,FlagAppend);
  if (bVar3) {
    piVar8 = this->mStdIn;
    do {
      iVar4 = pipe(piVar8);
      if (iVar4 != -1) break;
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    piVar9 = this->mStdOut;
    do {
      iVar4 = pipe(piVar9);
      if (iVar4 != -1) break;
      piVar10 = __errno_location();
    } while (*piVar10 == 4);
    piVar10 = this->mStdErr;
    do {
      iVar4 = pipe(piVar10);
      if (iVar4 != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    local_200 = piVar10;
    local_1f0 = piVar9;
    if (this->mMode == Sync) {
      do {
        iVar4 = pipe(this->mSync);
        if (iVar4 != -1) break;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
    }
    lVar20 = (long)(local_110._8_8_ - local_110._0_8_) >> 5;
    __argv = (char **)operator_new__(-(ulong)(lVar20 + 2U >> 0x3d != 0) | lVar20 * 8 + 0x10U);
    __argv[lVar20 + 1] = (char *)0x0;
    *__argv = local_d8.super_String.mString._M_dataplus._M_p;
    ppcVar14 = __argv;
    for (; local_110._0_8_ != local_110._8_8_; local_110._0_8_ = local_110._0_8_ + 0x20) {
      ppcVar14 = ppcVar14 + 1;
      *ppcVar14 = (((pointer)local_110._0_8_)->mString)._M_dataplus._M_p;
    }
    pSVar18 = (((_Vector_base<String,_std::allocator<String>_> *)&(local_210->mString)._M_dataplus)
              ->_M_impl).super__Vector_impl_data._M_start;
    pSVar1 = (pointer)(local_210->mString)._M_string_length;
    lVar20 = (long)pSVar1 - (long)pSVar18 >> 5;
    uVar19 = 0xffffffffffffffff;
    if (lVar20 + 1U < 0x2000000000000000) {
      uVar19 = lVar20 * 8 + 8;
    }
    local_210 = (String *)operator_new__(uVar19);
    (&(((_Vector_base<String,_std::allocator<String>_> *)&(local_210->mString)._M_dataplus)->_M_impl
      ).super__Vector_impl_data._M_start)[lVar20] = (pointer)0x0;
    pSVar12 = local_210;
    for (pSVar15 = pSVar18; pSVar15 != pSVar1; pSVar15 = pSVar15 + 1) {
      (((_Vector_base<String,_std::allocator<String>_> *)&(pSVar12->mString)._M_dataplus)->_M_impl).
      super__Vector_impl_data._M_start = (pointer)(pSVar15->mString)._M_dataplus._M_p;
      pSVar12 = (String *)&(pSVar12->mString)._M_string_length;
    }
    ProcessThread::setPending(1);
    _Var5 = fork();
    this->mPid = _Var5;
    if (_Var5 == -1) {
      ProcessThread::setPending(-1);
      piVar10 = local_1f0;
      piVar9 = local_200;
      do {
        iVar4 = close(this->mStdIn[1]);
        if (iVar4 != -1) break;
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      do {
        iVar4 = close(*piVar8);
        if (iVar4 != -1) break;
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      do {
        iVar4 = close(this->mStdOut[1]);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(*piVar10);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(this->mStdErr[1]);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(*piVar9);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(local_218);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(local_21c);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      String::String((String *)(local_1d0 + 0x28),"Fork failed",0xffffffffffffffff);
      std::__cxx11::string::operator=(local_208,(string *)(local_1d0 + 0x28));
      if ((__pthread_internal_list *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      operator_delete__(local_210);
      operator_delete__(__argv);
    }
    else {
      if (_Var5 == 0) {
        do {
          iVar4 = close(local_21c);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = close(this->mStdIn[1]);
          piVar9 = local_1f0;
          if (iVar4 != -1) break;
          piVar10 = __errno_location();
          piVar9 = local_1f0;
        } while (*piVar10 == 4);
        do {
          iVar4 = close(*piVar9);
          piVar10 = local_200;
          if (iVar4 != -1) break;
          piVar11 = __errno_location();
          piVar10 = local_200;
        } while (*piVar11 == 4);
        do {
          iVar4 = close(*piVar10);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = close(0);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = close(1);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = close(2);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = dup2(*piVar8,0);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = close(*piVar8);
          if (iVar4 != -1) break;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        do {
          iVar4 = dup2(this->mStdOut[1],1);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(this->mStdOut[1]);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = dup2(this->mStdErr[1],2);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(this->mStdErr[1]);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        if ((((this->mChRoot).super_String.mString._M_string_length == 0) ||
            (iVar4 = chroot((this->mChRoot).super_String.mString._M_dataplus._M_p), iVar4 == 0)) &&
           (((this->mCwd).super_String.mString._M_string_length == 0 ||
            (iVar4 = chdir((this->mCwd).super_String.mString._M_dataplus._M_p), iVar4 == 0)))) {
          if (pSVar18 == pSVar1) {
            execv(local_d8.super_String.mString._M_dataplus._M_p,__argv);
          }
          else {
            execve(local_d8.super_String.mString._M_dataplus._M_p,__argv,(char **)local_210);
          }
        }
        local_1a8[0] = 99;
        do {
          sVar13 = ::write(local_218,local_1d0 + 0x28,1);
          if ((int)sVar13 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        do {
          iVar4 = close(local_218);
          if (iVar4 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        _exit(1);
      }
      operator_delete__(local_210);
      operator_delete__(__argv);
      piVar10 = local_1f0;
      piVar9 = local_200;
      do {
        iVar4 = close(local_218);
        if (iVar4 != -1) break;
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      do {
        iVar4 = close(*piVar8);
        if (iVar4 != -1) break;
        piVar11 = __errno_location();
      } while (*piVar11 == 4);
      do {
        iVar4 = close(this->mStdOut[1]);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(this->mStdErr[1]);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        uVar6 = fcntl(this->mStdIn[1],3,0);
        if (uVar6 != 0xffffffff) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(this->mStdIn[1],4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar8 == 4);
      do {
        uVar6 = fcntl(*piVar10,3,0);
        if (uVar6 != 0xffffffff) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(*piVar10,4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar8 == 4);
      do {
        uVar6 = fcntl(*piVar9,3,0);
        if (uVar6 != 0xffffffff) break;
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      uVar6 = uVar6 | 0x800;
      do {
        iVar4 = fcntl(*piVar9,4,(ulong)uVar6);
        if (iVar4 != -1) break;
        piVar8 = __errno_location();
        uVar6 = 0xffffffff;
      } while (*piVar8 == 4);
      do {
        sVar13 = read(local_21c,local_b8,1);
        iVar4 = (int)sVar13;
        if (iVar4 != -1) {
          if (iVar4 == 0) goto LAB_00172e2c;
          if (iVar4 == 1) goto LAB_00172d6f;
          goto LAB_00172e3a;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      do {
        iVar4 = close(local_21c);
        if (iVar4 != -1) break;
      } while (*piVar8 == 4);
      String::String((String *)(local_1d0 + 0x28),
                     "Failed to read from closePipe during process start",0xffffffffffffffff);
      std::__cxx11::string::operator=(local_208,(string *)(local_1d0 + 0x28));
      if ((__pthread_internal_list *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_);
      }
      this->mPid = -1;
      ProcessThread::setPending(-1);
      this->mReturn = -1;
    }
    goto LAB_00172de7;
  }
  String::String((String *)(local_1d0 + 0x28),"Unable to set FD_CLOEXEC",0xffffffffffffffff);
  std::__cxx11::string::operator=(local_208,(string *)(local_1d0 + 0x28));
  if ((__pthread_internal_list *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  do {
    iVar4 = close(local_21c);
    if (iVar4 != -1) break;
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  EVar21 = Error;
  do {
    iVar4 = close(local_218);
    if (iVar4 != -1) break;
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  goto LAB_00172dea;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00172e2c:
    iVar4 = close(local_21c);
    if (iVar4 != -1) break;
  }
LAB_00172e3a:
  ProcessThread::addPid(this->mPid,this,this->mMode == Async);
  if (this->mMode != Async) {
    if (0 < (int)local_214) {
      Rct::gettime(&local_e8);
      auStack_170._72_8_ = (_Base_ptr)((ulong)local_214 / 1000);
      local_120 = (_Base_ptr)(ulong)((local_214 % 1000) * 1000);
    }
    if (((ulong)local_1f8 & 1) == 0) {
      closeStdIn(this,CloseForce);
      this->mWantStdInClosed = false;
    }
    __timeout = (timeval *)((long)&((SignalOnData *)auStack_170)->connections + 0x18);
    if ((int)local_214 < 1) {
      __timeout = (timeval *)0x0;
    }
    local_210 = &this->mStdOutBuffer;
    local_1f8 = &this->mStdOutIndex;
    local_1d0._32_8_ = &this->mStdErrBuffer;
    local_1d0._24_8_ = &this->mStdErrIndex;
    local_1d0._16_8_ = &this->mReadyReadStdErr;
    local_1e8 = (pthread_mutex_t *)&this->mMutex;
    local_118 = (Signal<std::function<void(Process*)>> *)&this->mFinished;
    EVar21 = Error;
LAB_0017308f:
    auStack_170._56_8_ = 0;
    auStack_170._64_8_ = (_Base_ptr)0x0;
    auStack_170._40_8_ = (__pthread_internal_list *)0x0;
    auStack_170._48_8_ = 0;
    auStack_170._24_8_ = 0;
    auStack_170._32_8_ = (__pthread_internal_list *)0x0;
    auStack_170._8_8_ = 0;
    auStack_170._16_8_ = 0;
    local_178 = 0;
    auStack_170._0_8_ = 0;
    local_188 = (_Base_ptr)0x0;
    p_Stack_180 = (_Base_ptr)0x0;
    local_198.__prev = (__pthread_internal_list *)0x0;
    local_198.__next = (__pthread_internal_list *)0x0;
    local_1a8._0_8_ = (__pthread_internal_list *)0x0;
    local_1a8._8_8_ = 0;
    local_b8._0_8_ = (EventLoop *)0x0;
    local_b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8._16_8_ = (_Map_pointer)0x0;
    local_b8._24_8_ = 0;
    local_b8._32_8_ = (_Elt_pointer)0x0;
    local_b8._40_8_ = (_Elt_pointer)0x0;
    local_b8._48_8_ = (_Elt_pointer)0x0;
    local_b8._56_8_ = (_Map_pointer)0x0;
    local_b8._64_8_ = (_Elt_pointer)0x0;
    local_b8._72_8_ = (_Elt_pointer)0x0;
    local_b8._80_8_ = (_Elt_pointer)0x0;
    local_b8._88_8_ = (_Map_pointer)0x0;
    local_b8._96_8_ = (pointer)0x0;
    local_b8._104_8_ = 0;
    local_b8._112_8_ = 0;
    local_b8._120_8_ = 0;
    iVar4 = this->mStdOut[0];
    iVar17 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar17 = iVar4;
    }
    *(ulong *)(local_1d0 + (long)(iVar17 >> 6) * 8 + 0x28) =
         *(ulong *)(local_1d0 + (long)(iVar17 >> 6) * 8 + 0x28) | 1L << ((byte)iVar4 & 0x3f);
    iVar17 = this->mStdErr[0];
    iVar16 = iVar17 + 0x3f;
    if (-1 < iVar17) {
      iVar16 = iVar17;
    }
    *(ulong *)(local_1d0 + (long)(iVar16 >> 6) * 8 + 0x28) =
         *(ulong *)(local_1d0 + (long)(iVar16 >> 6) * 8 + 0x28) | 1L << ((byte)iVar17 & 0x3f);
    if (iVar17 < iVar4) {
      iVar17 = iVar4;
    }
    iVar4 = this->mSync[0];
    iVar16 = iVar4 + 0x3f;
    if (-1 < iVar4) {
      iVar16 = iVar4;
    }
    *(ulong *)(local_1d0 + (long)(iVar16 >> 6) * 8 + 0x28) =
         *(ulong *)(local_1d0 + (long)(iVar16 >> 6) * 8 + 0x28) | 1L << ((byte)iVar4 & 0x3f);
    if (iVar17 <= iVar4) {
      iVar17 = iVar4;
    }
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    iVar4 = this->mStdIn[1];
    iVar16 = iVar17;
    if (iVar4 != -1) {
      iVar16 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar16 = iVar4;
      }
      *(ulong *)(local_b8 + (long)(iVar16 >> 6) * 8) =
           *(ulong *)(local_b8 + (long)(iVar16 >> 6) * 8) | 1L << ((byte)iVar4 & 0x3f);
      iVar16 = iVar4;
      if (iVar4 < iVar17) {
        iVar16 = iVar17;
      }
    }
    do {
      iVar4 = select(iVar16 + 1,(fd_set *)(local_1d0 + 0x28),(fd_set *)local_b8,(fd_set *)0x0,
                     __timeout);
      piVar8 = local_200;
      if (iVar4 != -1) {
        uVar6 = *local_1f0;
        uVar7 = uVar6 + 0x3f;
        if (-1 < (int)uVar6) {
          uVar7 = uVar6;
        }
        if ((*(ulong *)(local_1d0 + (long)((int)uVar7 >> 6) * 8 + 0x28) >> ((ulong)uVar6 & 0x3f) & 1
            ) != 0) {
          handleOutput(this,uVar6,local_210,local_1f8,&this->mReadyReadStdOut);
        }
        uVar6 = *piVar8;
        uVar7 = uVar6 + 0x3f;
        if (-1 < (int)uVar6) {
          uVar7 = uVar6;
        }
        if ((*(ulong *)(local_1d0 + (long)((int)uVar7 >> 6) * 8 + 0x28) >> ((ulong)uVar6 & 0x3f) & 1
            ) != 0) {
          handleOutput(this,uVar6,(String *)local_1d0._32_8_,(int *)local_1d0._24_8_,
                       (Signal<std::function<void_(Process_*)>_> *)local_1d0._16_8_);
        }
        uVar6 = this->mStdIn[1];
        if (uVar6 != 0xffffffff) {
          uVar7 = uVar6 + 0x3f;
          if (-1 < (int)uVar6) {
            uVar7 = uVar6;
          }
          if ((*(ulong *)(local_b8 + (long)((int)uVar7 >> 6) * 8) >> ((ulong)uVar6 & 0x3f) & 1) != 0
             ) {
            handleInput(this,uVar6);
          }
        }
        uVar6 = this->mSync[0];
        uVar7 = uVar6 + 0x3f;
        if (-1 < (int)uVar6) {
          uVar7 = uVar6;
        }
        if ((*(ulong *)(local_1d0 + (long)((int)uVar7 >> 6) * 8 + 0x28) >> ((ulong)uVar6 & 0x3f) & 1
            ) == 0) {
          if (local_214 == 0) {
            bVar3 = true;
          }
          else {
            Rct::gettime(&local_f8);
            iVar17 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_usec),8) >> 7)
                     - (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_e8.tv_usec),0xc) >> 0x1f
                       )) + (undefined4)local_e8.tv_sec * -1000 +
                     ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_f8.tv_usec),8) >> 7)
                     - (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_f8.tv_usec),0xc) >> 0x1f)
                     ) + (undefined4)local_f8.tv_sec * 1000;
            iVar4 = local_214 - iVar17;
            bVar3 = iVar4 != 0 && iVar17 <= (int)local_214;
            if (iVar4 == 0 || (int)local_214 < iVar17) {
              if ((this->mReturn == -2) && (this->mPid != -1)) {
                this->mReturn = -3;
                ::kill(this->mPid,0xf);
              }
              ProcessThread::removePid(this->mPid);
              String::String((String *)local_1e0,"Timed out",0xffffffffffffffff);
              std::__cxx11::string::operator=(local_208,(string *)local_1e0);
              if (local_1e0[0] != (Process *)local_1d0) {
                operator_delete(local_1e0[0]);
              }
              EVar21 = TimedOut;
            }
            else {
              auStack_170._72_8_ = (_Base_ptr)(long)(iVar4 / 1000);
              local_120 = (_Base_ptr)(long)((iVar4 % 1000) * 1000);
            }
          }
          goto LAB_00173421;
        }
        iVar4 = pthread_mutex_lock(local_1e8);
        if (iVar4 != 0) {
          std::__throw_system_error(iVar4);
        }
        if (this->mSync[1] != -1) {
          __assert_fail("mSync[1] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                        ,0x239,
                        "Process::ExecState Process::startInternal(const Path &, const List<String> &, const List<String> &, int, unsigned int)"
                       );
        }
        handleOutput(this,this->mStdOut[0],local_210,local_1f8,&this->mReadyReadStdOut);
        handleOutput(this,this->mStdErr[0],(String *)local_1d0._32_8_,(int *)local_1d0._24_8_,
                     (Signal<std::function<void_(Process_*)>_> *)local_1d0._16_8_);
        closeStdOut(this);
        closeStdErr(this);
        goto LAB_001733d5;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    String::String((String *)local_1e0,"Sync select failed: ",0xffffffffffffffff);
    std::__cxx11::string::operator=(local_208,(string *)local_1e0);
    if (local_1e0[0] != (Process *)local_1d0) {
      operator_delete(local_1e0[0]);
    }
    Rct::strerror((Rct *)local_1e0,*piVar8);
    std::__cxx11::string::_M_append((char *)local_208,(ulong)local_1e0[0]);
    if (local_1e0[0] != (Process *)local_1d0) {
      operator_delete(local_1e0[0]);
    }
    bVar3 = false;
    EVar21 = Error;
    goto LAB_00173421;
  }
  EventLoop::eventLoop();
  uVar2 = local_b8._0_8_;
  if ((EventLoop *)local_b8._0_8_ != (EventLoop *)0x0) {
    uVar6 = *piVar10;
    local_198.__prev = (__pthread_internal_list *)0x0;
    local_198.__next = (__pthread_internal_list *)0x0;
    local_1a8._0_8_ = (__pthread_internal_list *)0x0;
    local_1a8._8_8_ = 0;
    local_1a8._0_8_ = operator_new(0x18);
    ((__pthread_internal_list *)local_1a8._0_8_)->__prev =
         (__pthread_internal_list *)processCallback;
    ((__pthread_internal_list *)local_1a8._0_8_)->__next = (__pthread_internal_list *)0x0;
    ((__pthread_internal_list *)(local_1a8._0_8_ + 0x10))->__prev = (__pthread_internal_list *)this;
    local_198.__next =
         (__pthread_internal_list *)
         std::
         _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
         ::_M_invoke;
    local_198.__prev =
         (__pthread_internal_list *)
         std::
         _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
         ::_M_manager;
    EventLoop::registerSocket
              ((EventLoop *)uVar2,uVar6,1,(function<void_(int,_unsigned_int)> *)(local_1d0 + 0x28));
    if (local_198.__prev != (__pthread_internal_list *)0x0) {
      (*(code *)local_198.__prev)(local_1d0 + 0x28,local_1d0 + 0x28,3);
    }
    uVar2 = local_b8._0_8_;
    uVar6 = *local_200;
    local_198.__prev = (__pthread_internal_list *)0x0;
    local_198.__next = (__pthread_internal_list *)0x0;
    local_1a8._0_8_ = (__pthread_internal_list *)0x0;
    local_1a8._8_8_ = 0;
    local_1a8._0_8_ = operator_new(0x18);
    ((__pthread_internal_list *)local_1a8._0_8_)->__prev =
         (__pthread_internal_list *)processCallback;
    ((__pthread_internal_list *)local_1a8._0_8_)->__next = (__pthread_internal_list *)0x0;
    ((__pthread_internal_list *)(local_1a8._0_8_ + 0x10))->__prev = (__pthread_internal_list *)this;
    local_198.__next =
         (__pthread_internal_list *)
         std::
         _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
         ::_M_invoke;
    local_198.__prev =
         (__pthread_internal_list *)
         std::
         _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
         ::_M_manager;
    EventLoop::registerSocket
              ((EventLoop *)uVar2,uVar6,1,(function<void_(int,_unsigned_int)> *)(local_1d0 + 0x28));
    if (local_198.__prev != (__pthread_internal_list *)0x0) {
      (*(code *)local_198.__prev)(local_1d0 + 0x28,local_1d0 + 0x28,3);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  EVar21 = Done;
  goto LAB_00172dea;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_001733d5:
    iVar4 = close(this->mSync[0]);
    if (iVar4 != -1) break;
  }
  this->mSync[0] = -1;
  pthread_mutex_unlock(local_1e8);
  local_1e0[0] = this;
  Signal<std::function<void(Process*)>>::operator()(local_118,local_1e0);
  EVar21 = Done;
  bVar3 = false;
LAB_00173421:
  if (!bVar3) goto LAB_00172dea;
  goto LAB_0017308f;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_00172d6f:
    iVar4 = close(local_21c);
    if (iVar4 != -1) break;
  }
  String::String((String *)(local_1d0 + 0x28),"Process failed to start",0xffffffffffffffff);
  std::__cxx11::string::operator=(local_208,(string *)(local_1d0 + 0x28));
  if ((__pthread_internal_list *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_);
  }
  this->mReturn = -1;
  this->mPid = -1;
  ProcessThread::setPending(-1);
LAB_00172de7:
  EVar21 = Error;
LAB_00172dea:
  std::vector<String,_std::allocator<String>_>::~vector
            ((vector<String,_std::allocator<String>_> *)local_110);
LAB_00172df7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.super_String.mString._M_dataplus._M_p != &local_d8.super_String.mString.field_2) {
    operator_delete(local_d8.super_String.mString._M_dataplus._M_p);
  }
  return EVar21;
}

Assistant:

Process::ExecState Process::startInternal(const Path &command, const List<String> &a, const List<String> &environment,
                                          int timeout, unsigned int execFlags)
{
    mErrorString.clear();

    const char *path = 0;
    for (const auto &it : environment) {
        if (it.startsWith("PATH=")) {
            path = it.constData() + 5;
            break;
        }
    }
    Path cmd = findCommand(command, path);
    if (cmd.isEmpty()) {
        mErrorString = "Command not found";
        return Error;
    }
    List<String> arguments = a;
    int err;

    int closePipe[2];
    eintrwrap(err, ::pipe(closePipe));
#ifdef HAVE_CLOEXEC
    if (!SocketClient::setFlags(closePipe[1], FD_CLOEXEC, F_GETFD, F_SETFD)) {
        mErrorString = "Unable to set FD_CLOEXEC";
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(closePipe[1]));
        return Error;
    }
#else
#warning No CLOEXEC, Process might have problematic behavior
#endif

    eintrwrap(err, ::pipe(mStdIn));
    eintrwrap(err, ::pipe(mStdOut));
    eintrwrap(err, ::pipe(mStdErr));
    if (mMode == Sync)
        eintrwrap(err, ::pipe(mSync));

    const char **args = new const char*[arguments.size() + 2];
    // const char* args[arguments.size() + 2];
    args[arguments.size() + 1] = 0;
    args[0] = cmd.nullTerminated();
    int pos = 1;
    for (List<String>::const_iterator it = arguments.begin(); it != arguments.end(); ++it) {
        args[pos] = it->nullTerminated();
        // printf("arg: '%s'\n", args[pos]);
        ++pos;
    }

    const bool hasEnviron = !environment.empty();

    const char **env = new const char*[environment.size() + 1];
    env[environment.size()] = 0;

    if (hasEnviron) {
        pos = 0;
        //printf("fork, about to exec '%s'\n", cmd.nullTerminated());
        for (List<String>::const_iterator it = environment.begin(); it != environment.end(); ++it) {
            env[pos] = it->nullTerminated();
            //printf("env: '%s'\n", env[pos]);
            ++pos;
        }
    }

    ProcessThread::setPending(1);

    mPid = ::fork();
    if (mPid == -1) {
        //printf("fork, something horrible has happened %d\n", errno);
        // bail out

        ProcessThread::setPending(-1);

        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[1]));
        eintrwrap(err, ::close(mStdErr[0]));
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(closePipe[0]));
        mErrorString = "Fork failed";
        delete[] env;
        delete[] args;
        return Error;
    } else if (mPid == 0) {
        //printf("fork, in child\n");
        // child, should do some error checking here really
        eintrwrap(err, ::close(closePipe[0]));
        eintrwrap(err, ::close(mStdIn[1]));
        eintrwrap(err, ::close(mStdOut[0]));
        eintrwrap(err, ::close(mStdErr[0]));

        eintrwrap(err, ::close(STDIN_FILENO));
        eintrwrap(err, ::close(STDOUT_FILENO));
        eintrwrap(err, ::close(STDERR_FILENO));

        eintrwrap(err, ::dup2(mStdIn[0], STDIN_FILENO));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::dup2(mStdOut[1], STDOUT_FILENO));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::dup2(mStdErr[1], STDERR_FILENO));
        eintrwrap(err, ::close(mStdErr[1]));

        int ret;
        if (!mChRoot.isEmpty() && ::chroot(mChRoot.constData())) {
            goto error;
        }
        if (!mCwd.isEmpty() && ::chdir(mCwd.constData())) {
            goto error;
        }
        if (hasEnviron) {
            ret = ::execve(cmd.nullTerminated(), const_cast<char* const*>(args), const_cast<char* const*>(env));
        } else {
            ret = ::execv(cmd.nullTerminated(), const_cast<char* const*>(args));
        }
        // notify the parent process
  error:
        const char c = 'c';
        eintrwrap(err, ::write(closePipe[1], &c, 1));
        eintrwrap(err, ::close(closePipe[1]));
        ::_exit(1);
        (void)ret;
        //printf("fork, exec seemingly failed %d, %d %s\n", ret, errno, Rct::strerror().constData());
    } else {
        delete[] env;
        delete[] args;

        // parent
        eintrwrap(err, ::close(closePipe[1]));
        eintrwrap(err, ::close(mStdIn[0]));
        eintrwrap(err, ::close(mStdOut[1]));
        eintrwrap(err, ::close(mStdErr[1]));

        //printf("fork, in parent\n");

        int flags;
        eintrwrap(flags, fcntl(mStdIn[1], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdIn[1], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdOut[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdOut[0], F_SETFL, flags | O_NONBLOCK));
        eintrwrap(flags, fcntl(mStdErr[0], F_GETFL, 0));
        eintrwrap(flags, fcntl(mStdErr[0], F_SETFL, flags | O_NONBLOCK));

        // block until exec is called in the child or until exec fails
        {
            char c;
            eintrwrap(err, ::read(closePipe[0], &c, 1));
            (void)c;

            if (err == -1) {
                // bad
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Failed to read from closePipe during process start";
                mPid = -1;
                ProcessThread::setPending(-1);
                mReturn = ReturnCrashed;
                return Error;
            } else if (err == 0) {
                // process has started successfully
                eintrwrap(err, ::close(closePipe[0]));
            } else if (err == 1) {
                // process start failed
                eintrwrap(err, ::close(closePipe[0]));
                mErrorString = "Process failed to start";
                mReturn = ReturnCrashed;
                mPid = -1;
                ProcessThread::setPending(-1);
                return Error;
            }
        }

        ProcessThread::addPid(mPid, this, (mMode == Async));

        //printf("fork, about to add fds: stdin=%d, stdout=%d, stderr=%d\n", mStdIn[1], mStdOut[0], mStdErr[0]);
        if (mMode == Async) {
            if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
                loop->registerSocket(mStdOut[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
                loop->registerSocket(mStdErr[0], EventLoop::SocketRead, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            }
        } else {
            // select and stuff
            timeval started, now, timeoutForSelect;
            if (timeout > 0) {
                Rct::gettime(&started);
                timeoutForSelect.tv_sec = timeout / 1000;
                timeoutForSelect.tv_usec = (timeout % 1000) * 1000;
            }
            if (!(execFlags & NoCloseStdIn)) {
                closeStdIn(CloseForce);
                mWantStdInClosed = false;
            }
            for (;;) {
                // set up all the select crap
                fd_set rfds, wfds;
                FD_ZERO(&rfds);
                FD_ZERO(&wfds);
                int max = 0;
                FD_SET(mStdOut[0], &rfds);
                max = std::max(max, mStdOut[0]);
                FD_SET(mStdErr[0], &rfds);
                max = std::max(max, mStdErr[0]);
                FD_SET(mSync[0], &rfds);
                max = std::max(max, mSync[0]);
                if (mStdIn[1] != -1) {
                    FD_SET(mStdIn[1], &wfds);
                    max = std::max(max, mStdIn[1]);
                }
                int ret;
                eintrwrap(ret, ::select(max + 1, &rfds, &wfds, 0, timeout > 0 ? &timeoutForSelect : 0));
                if (ret == -1) { // ow
                    mErrorString = "Sync select failed: ";
                    mErrorString += Rct::strerror();
                    return Error;
                }
                // check fds and stuff
                if (FD_ISSET(mStdOut[0], &rfds))
                    handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                if (FD_ISSET(mStdErr[0], &rfds))
                    handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);
                if (mStdIn[1] != -1 && FD_ISSET(mStdIn[1], &wfds))
                    handleInput(mStdIn[1]);
                if (FD_ISSET(mSync[0], &rfds)) {
                    // we're done
                    {
                        std::lock_guard<std::mutex> lock(mMutex);
                        assert(mSync[1] == -1);

                        // try to read all remaining data on stdout and stderr
                        handleOutput(mStdOut[0], mStdOutBuffer, mStdOutIndex, mReadyReadStdOut);
                        handleOutput(mStdErr[0], mStdErrBuffer, mStdErrIndex, mReadyReadStdErr);

                        closeStdOut();
                        closeStdErr();

                        int w;
                        eintrwrap(w, ::close(mSync[0]));
                        mSync[0] = -1;
                    }
                    mFinished(this);
                    return Done;
                }
                if (timeout) {
                    Rct::gettime(&now);

                    // lasted is the amount of time we spent until now in ms
                    const int lasted = Rct::timevalDiff(&now, &started);
                    if (lasted >= timeout) {
                        // timeout, we're done
                        kill(); // attempt to kill

                        // we need to remove this Process object from
                        // ProcessThread, because ProcessThread will try to
                        // finish() this object. However, this object may
                        // already have been deleted *before* ProcessThread
                        // runs, creating a segfault.
                        ProcessThread::removePid(mPid);

                        mErrorString = "Timed out";
                        return TimedOut;
                    }

                    // (timeout - lasted) is guaranteed to be > 0 because of
                    // the check above.
                    timeoutForSelect.tv_sec = (timeout - lasted) / 1000;
                    timeoutForSelect.tv_usec = ((timeout - lasted) % 1000) * 1000;
                }
            }
        }
    }
    return Done;
}